

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O2

void __thiscall
crypto_tests::CryptoTest::TestChaCha20Poly1305
          (CryptoTest *this,string *plain_hex,string *aad_hex,string *key_hex,Nonce96 nonce,
          string *cipher_hex)

{
  long lVar1;
  Span<const_std::byte> aad_00;
  Nonce96 nonce_00;
  Nonce96 nonce_01;
  Span<std::byte> plain1;
  Span<std::byte> cipher;
  Span<std::byte> plain2;
  bool bVar2;
  readonly_property<bool> rVar3;
  byte *pbVar4;
  element_type *peVar5;
  int iVar6;
  size_t i;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  pointer pbVar10;
  iterator pvVar11;
  element_type *peVar12;
  iterator pvVar13;
  element_type *peVar14;
  element_type *peVar15;
  long in_FS_OFFSET;
  undefined4 uVar16;
  string_view hex_str;
  string_view hex_str_00;
  string_view hex_str_01;
  string_view hex_str_02;
  Span<const_std::byte> key_00;
  Span<const_std::byte> plain1_00;
  const_string file;
  Span<const_std::byte> cipher_00;
  const_string file_00;
  const_string file_01;
  Span<const_std::byte> key_01;
  Nonce96 nonce_02;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  Span<const_std::byte> plain2_00;
  Span<const_std::byte> aad_01;
  Span<std::byte> keystream_00;
  check_type cVar17;
  undefined4 uVar18;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  assertion_result local_240;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  byte *local_208;
  size_t sStack_200;
  pointer local_1f8;
  element_type *peStack_1f0;
  uint local_1e8;
  undefined4 uStack_1e4;
  element_type *peStack_1e0;
  char *local_1d8;
  char *local_1d0;
  lazy_ostream local_1c8;
  undefined1 *local_1b8;
  pointer *local_1b0;
  vector<std::byte,_std::allocator<std::byte>_> decipher;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  pointer local_168;
  pointer pbStack_160;
  uint local_158;
  undefined4 uStack_154;
  element_type *peStack_150;
  pointer local_148;
  check_type cStack_140;
  vector<std::byte,_std::allocator<std::byte>_> keystream;
  vector<std::byte,_std::allocator<std::byte>_> expected_cipher;
  vector<std::byte,_std::allocator<std::byte>_> key;
  vector<std::byte,_std::allocator<std::byte>_> aad;
  vector<std::byte,_std::allocator<std::byte>_> plain;
  char *local_c0;
  element_type *peStack_b8;
  AEADChaCha20Poly1305 aead;
  
  peVar12 = (element_type *)nonce.second;
  uVar9 = nonce.first;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  hex_str._M_str = (plain_hex->_M_dataplus)._M_p;
  hex_str._M_len = plain_hex->_M_string_length;
  peVar14 = peVar12;
  ParseHex<std::byte>(&plain,hex_str);
  hex_str_00._M_str = (aad_hex->_M_dataplus)._M_p;
  hex_str_00._M_len = aad_hex->_M_string_length;
  ParseHex<std::byte>(&aad,hex_str_00);
  hex_str_01._M_str = (key_hex->_M_dataplus)._M_p;
  hex_str_01._M_len = key_hex->_M_string_length;
  ParseHex<std::byte>(&key,hex_str_01);
  hex_str_02._M_str = (cipher_hex->_M_dataplus)._M_p;
  hex_str_02._M_len = cipher_hex->_M_string_length;
  ParseHex<std::byte>(&expected_cipher,hex_str_02);
  iVar6 = 10;
  while (iVar6 != 0) {
    if (iVar6 == 10) {
      peVar15 = (element_type *)
                (plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                -(long)plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start);
    }
    else {
      peVar15 = (element_type *)
                RandomMixin<FastRandomContext>::randrange<unsigned_long>
                          (&(this->super_BasicTestingSetup).m_rng.
                            super_RandomMixin<FastRandomContext>,
                           (unsigned_long)
                           (plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                            super__Vector_impl_data._M_finish +
                           (1 - (long)plain.
                                      super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                                      _M_impl.super__Vector_impl_data._M_start)));
    }
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              (&keystream,
               (size_type)
               (plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (0x10 - (long)plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl
                             .super__Vector_impl_data._M_start)),(allocator_type *)&aead);
    key_00.m_size =
         (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    key_00.m_data =
         key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    AEADChaCha20Poly1305::AEADChaCha20Poly1305(&aead,key_00);
    if (iVar6 == 10) {
      local_1c8._8_8_ =
           (long)aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_start;
      aad_01.m_size =
           keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start =
           keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_240._0_4_ = uVar9;
      local_1c8._vptr_lazy_ostream =
           (_func_int **)
           aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      pbVar4 = (byte *)0x0;
      pbVar10 = (pointer)0x0;
      peVar5 = (element_type *)
               (plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish +
               -(long)plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                      super__Vector_impl_data._M_start);
      keystream_00.m_size = (pointer)local_240._0_8_;
      local_240.m_message.px = peVar12;
      decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish = aad_01.m_size;
      cVar17 = (check_type)local_1c8._8_8_;
    }
    else {
      pbVar4 = plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start + (long)peVar15;
      pbVar10 = plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish + -(long)pbVar4;
      local_148 = aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      _cStack_140 = (check_type)
                    ((long)aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                          super__Vector_impl_data._M_start);
      local_168 = keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      aad_01.m_size =
           keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_finish +
           -(long)keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      keystream_00.m_size = (pointer)CONCAT44(uStack_154,uVar9);
      peVar5 = peVar15;
      pbStack_160 = aad_01.m_size;
      local_158 = uVar9;
      peStack_150 = peVar12;
      cVar17 = _cStack_140;
    }
    aad_00.m_size._0_4_ = (check_type)cVar17;
    aad_00.m_data =
         aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    aad_00.m_size._4_4_ = (int)((ulong)cVar17 >> 0x20);
    nonce_01.second = (unsigned_long)peVar12;
    nonce_01._0_8_ = keystream_00.m_size;
    cipher.m_size = (size_t)aad_01.m_size;
    cipher.m_data =
         keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    plain1_00.m_size = (size_t)peVar5;
    plain1_00.m_data =
         plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    plain2_00.m_size = (size_t)pbVar10;
    plain2_00.m_data = pbVar4;
    AEADChaCha20Poly1305::Encrypt(&aead,plain1_00,plain2_00,aad_00,nonce_01,cipher);
    local_178 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_170 = "";
    local_188 = &boost::unit_test::basic_cstring<char_const>::null;
    local_180 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x110;
    file.m_begin = (iterator)&local_178;
    msg.m_end = (iterator)peVar14;
    msg.m_begin = (iterator)pbVar10;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_188,msg);
    bVar2 = std::operator==(&keystream,&expected_cipher);
    decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,bVar2);
    decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_240._0_8_ = "cipher == expected_cipher";
    local_240.m_message.px = (element_type *)0xb906fc;
    local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
    local_1c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
    local_1b8 = boost::unit_test::lazy_ostream::inst;
    local_1b0 = (pointer *)&local_240;
    local_1d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_1d0 = "";
    pvVar11 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&decipher,&local_1c8,1,0,WARN,cVar17,(size_t)&local_1d8,0x110);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<std::byte,_std::allocator<std::byte>_>::vector
              (&decipher,
               (size_type)
               (keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish +
               (-0x10 - (long)keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                              _M_impl.super__Vector_impl_data._M_start)),
               (allocator_type *)&local_1c8);
    peVar14 = peStack_b8;
    cipher_00.m_size =
         (long)keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start;
    aad_01.m_size =
         aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_finish +
         -(long)aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
    peStack_b8._0_4_ = (check_type)nonce.second;
    cVar17 = (check_type)peStack_b8;
    peStack_b8._4_4_ = nonce.second._4_4_;
    uVar18 = peStack_b8._4_4_;
    if (iVar6 == 10) {
      peVar15 = (element_type *)
                (decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish +
                -(long)decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start);
      local_240._0_8_ =
           decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_c0 = (char *)CONCAT44(local_c0._4_4_,uVar9);
      local_1c8._vptr_lazy_ostream = (_func_int **)0x0;
      local_1c8.m_empty = false;
      local_1c8._9_7_ = 0;
      pbVar4 = (byte *)0x0;
      sVar8 = 0;
      uVar16 = local_c0._4_4_;
      local_240.m_message.px = peVar15;
      peStack_b8 = peVar12;
    }
    else {
      local_1f8 = decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                  super__Vector_impl_data._M_start;
      pbVar4 = decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start + (long)peVar15;
      sVar8 = (long)decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pbVar4;
      uVar16 = uStack_1e4;
      local_208 = pbVar4;
      sStack_200 = sVar8;
      peStack_1f0 = peVar15;
      local_1e8 = uVar9;
      peStack_1e0 = peVar12;
      peStack_b8 = peVar14;
    }
    nonce_00._4_4_ = uVar16;
    nonce_00.first = uVar9;
    nonce_00.second._0_4_ = cVar17;
    nonce_00.second._4_4_ = uVar18;
    plain1.m_size = (size_t)peVar15;
    plain1.m_data =
         decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    plain2.m_size = sVar8;
    plain2.m_data = pbVar4;
    cipher_00.m_data =
         keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    aad_01.m_data =
         aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
         super__Vector_impl_data._M_start;
    rVar3.super_class_property<bool>.value =
         (class_property<bool>)
         AEADChaCha20Poly1305::Decrypt
                   ((AEADChaCha20Poly1305 *)&aead.m_chacha20,cipher_00,aad_01,nonce_00,plain1,plain2
                   );
    local_218 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_210 = "";
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    local_220 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x11a;
    file_00.m_begin = (iterator)&local_218;
    msg_00.m_end = pvVar11;
    msg_00.m_begin = (iterator)aad_01.m_size;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_228,
               msg_00);
    local_240.m_message.px = (element_type *)0x0;
    local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_c0 = "ret";
    peStack_b8 = (element_type *)0xc508e1;
    local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
    local_1c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
    local_1b8 = boost::unit_test::lazy_ostream::inst;
    local_1b0 = (pointer *)&local_c0;
    local_250 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_248 = "";
    pvVar11 = &DAT_00000001;
    pvVar13 = (iterator)0x0;
    local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)rVar3.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              (&local_240,&local_1c8,1,0,WARN,CONCAT44(uVar18,cVar17),(size_t)&local_250,0x11a);
    boost::detail::shared_count::~shared_count(&local_240.m_message.pn);
    local_260 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_258 = "";
    local_270 = &boost::unit_test::basic_cstring<char_const>::null;
    local_268 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x11b;
    file_01.m_begin = (iterator)&local_260;
    msg_01.m_end = pvVar13;
    msg_01.m_begin = pvVar11;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_270,
               msg_01);
    local_240.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         std::operator==((vector<std::byte,_std::allocator<std::byte>_> *)
                         &decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>,&plain)
    ;
    local_240.m_message.px = (element_type *)0x0;
    local_240.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_c0 = "decipher == plain";
    peStack_b8 = (element_type *)0xb9070e;
    local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
    local_1c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
    local_1b8 = boost::unit_test::lazy_ostream::inst;
    local_1b0 = (pointer *)&local_c0;
    local_280 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_278 = "";
    peVar14 = (element_type *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_240,&local_1c8,1,0,WARN,CONCAT44(uVar18,cVar17),(size_t)&local_280,0x11b);
    boost::detail::shared_count::~shared_count(&local_240.m_message.pn);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              (&decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
    ChaCha20::~ChaCha20(&aead.m_chacha20);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              (&keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
    iVar6 = iVar6 + -1;
  }
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (&keystream,
             (long)plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start,(allocator_type *)&aead);
  key_01.m_size =
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start;
  key_01.m_data =
       key.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.super__Vector_impl_data
       ._M_start;
  AEADChaCha20Poly1305::AEADChaCha20Poly1305(&aead,key_01);
  keystream_00.m_size =
       keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_finish +
       -(long)keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start;
  nonce_02._4_4_ = 0;
  nonce_02.first = uVar9;
  nonce_02.second = (unsigned_long)peVar12;
  keystream_00.m_data =
       keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
       super__Vector_impl_data._M_start;
  AEADChaCha20Poly1305::Keystream(&aead,nonce_02,keystream_00);
  for (uVar7 = 0;
      uVar7 < (ulong)((long)plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                           super__Vector_impl_data._M_start); uVar7 = uVar7 + 1) {
    local_290 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_288 = "";
    local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_298 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x123;
    file_02.m_begin = (iterator)&local_290;
    msg_02.m_end = (iterator)peVar14;
    msg_02.m_begin = (iterator)keystream_00.m_size;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2a0,
               msg_02);
    local_1c8._8_8_ = local_1c8._8_8_ & 0xffffffffffffff00;
    local_1c8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
    local_1b8 = boost::unit_test::lazy_ostream::inst;
    local_1b0 = (pointer *)0xc7f1cc;
    local_2b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_2a8 = "";
    decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT71(decipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                           _M_impl.super__Vector_impl_data._M_start[uVar7] ^
                           plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar7]);
    keystream_00.m_size = (pointer)0x2;
    peVar14 = (element_type *)&decipher;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::byte,std::byte>
              (&local_1c8,&local_2b0,0x123,1,2,(element_type *)&decipher,0xb9070f,
               (int)(expected_cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar7),"expected_cipher[i]");
  }
  ChaCha20::~ChaCha20(&aead.m_chacha20);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&keystream.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&expected_cipher.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&key.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&aad.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&plain.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestChaCha20Poly1305(const std::string& plain_hex, const std::string& aad_hex, const std::string& key_hex, ChaCha20::Nonce96 nonce, const std::string& cipher_hex)
{
    auto plain = ParseHex<std::byte>(plain_hex);
    auto aad = ParseHex<std::byte>(aad_hex);
    auto key = ParseHex<std::byte>(key_hex);
    auto expected_cipher = ParseHex<std::byte>(cipher_hex);

    for (int i = 0; i < 10; ++i) {
        // During i=0, use single-plain Encrypt/Decrypt; others use a split at prefix.
        size_t prefix = i ? m_rng.randrange(plain.size() + 1) : plain.size();
        // Encrypt.
        std::vector<std::byte> cipher(plain.size() + AEADChaCha20Poly1305::EXPANSION);
        AEADChaCha20Poly1305 aead{key};
        if (i == 0) {
            aead.Encrypt(plain, aad, nonce, cipher);
        } else {
            aead.Encrypt(Span{plain}.first(prefix), Span{plain}.subspan(prefix), aad, nonce, cipher);
        }
        BOOST_CHECK(cipher == expected_cipher);

        // Decrypt.
        std::vector<std::byte> decipher(cipher.size() - AEADChaCha20Poly1305::EXPANSION);
        bool ret{false};
        if (i == 0) {
            ret = aead.Decrypt(cipher, aad, nonce, decipher);
        } else {
            ret = aead.Decrypt(cipher, aad, nonce, Span{decipher}.first(prefix), Span{decipher}.subspan(prefix));
        }
        BOOST_CHECK(ret);
        BOOST_CHECK(decipher == plain);
    }

    // Test Keystream output.
    std::vector<std::byte> keystream(plain.size());
    AEADChaCha20Poly1305 aead{key};
    aead.Keystream(nonce, keystream);
    for (size_t i = 0; i < plain.size(); ++i) {
        BOOST_CHECK_EQUAL(plain[i] ^ keystream[i], expected_cipher[i]);
    }
}